

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_cgreen_time.c
# Opt level: O3

uint32_t cgreen_time_get_current_milliseconds(void)

{
  int iVar1;
  uint32_t uVar2;
  timeval tv;
  timeval local_18;
  
  uVar2 = 0;
  iVar1 = gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  if (iVar1 == 0) {
    uVar2 = ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_18.tv_usec),8) >> 7) -
            (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_18.tv_usec),0xc) >> 0x1f)) +
            (int)local_18.tv_sec * 1000;
  }
  else {
    __fprintf_chk(_stderr,1,"cgreen error: could not get time of day\n");
  }
  return uVar2;
}

Assistant:

uint32_t cgreen_time_get_current_milliseconds(void) {
#ifdef __CYGWIN__
    /* TODO: This is actually the POSIX recommended way to do this */
    struct timespec ts;
    if (clock_gettime(CLOCK_REALTIME, &ts) != 0) {
        fprintf(stderr, "cgreen error: could not get time\n");
        return 0;
    }

    return ts.tv_sec * 1000u + ts.tv_nsec / 1000000u;
#else    
    struct timeval tv;
    if (gettimeofday(&tv, NULL) != 0) {
        fprintf(stderr, "cgreen error: could not get time of day\n");
        return 0;
    }
    return tv.tv_sec * 1000u + tv.tv_usec / 1000u;
#endif
}